

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* kratos::create_variables
            (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,Var *var,string *name)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  VarType VVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference this;
  element_type *peVar8;
  reference pPVar9;
  reference pvVar10;
  Var *pVVar11;
  reference format_str;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar13;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  string_view format_str_06;
  string_view format_str_07;
  string_view format_str_08;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d00;
  string local_c88 [32];
  undefined1 local_c68 [8];
  Variable v_4;
  undefined1 local_b98 [8];
  Variable v_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cond;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> new_name_transformed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> transformed_name;
  uint i;
  value_type *new_name_3;
  string local_ac8;
  undefined1 local_aa8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string base_name;
  string select_name;
  value_type *size;
  VarVarSlice *var_var_slice;
  string local_9c8 [32];
  string local_9a8;
  undefined1 local_988 [8];
  Variable v_2;
  string new_name_2;
  string *attr_name_1;
  PackedStructFieldDef *iter_1;
  iterator __end5;
  iterator __begin5;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range5;
  __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_8d8;
  shared_ptr<kratos::PackedStruct> *def_1;
  VarPackedStruct *p_1;
  string local_850 [32];
  string local_830;
  undefined1 local_810 [8];
  Variable v_1;
  string new_name_1;
  string *attr_name;
  PackedStructFieldDef *iter;
  iterator __end4;
  iterator __begin4;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range4;
  __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_760;
  shared_ptr<kratos::PackedStruct> *def;
  PortPackedStruct *p;
  string local_6d8;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_6b8;
  uint *s_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3_1;
  string value;
  uint *s;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  Variable v;
  string new_name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *slice;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  slices;
  string *name_local;
  Var *var_local;
  vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_550;
  basic_string_view<char> local_548;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  local_538;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_510;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *vargs;
  bool *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_4e8;
  basic_string_view<char> local_4d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  local_4c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_4a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *vargs_1;
  char (*local_490) [9];
  char *local_488;
  string *local_480;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_478;
  basic_string_view<char> local_468;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_430;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  string *local_420;
  char *local_418;
  bool *local_410;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_408;
  basic_string_view<char> local_3f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3c0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  string *local_3b0;
  char *local_3a8;
  bool *local_3a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_398;
  basic_string_view<char> local_388;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_350;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_5;
  string *local_340;
  char *local_338;
  string *local_330;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_328;
  basic_string_view<char> local_318;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  string *local_2d0;
  char *local_2c8;
  string *local_2c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2b8;
  basic_string_view<char> local_2a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_298;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_270;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs_6;
  pointer *local_260;
  char *local_258;
  undefined1 *local_250;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_248;
  basic_string_view<char> local_238;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_228;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_200;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs_7;
  reference local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1d8;
  basic_string_view<char> local_1c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_198;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs_8;
  char (*local_188) [11];
  char *local_180;
  bool *local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_170;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_160;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_158;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_150;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_130;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_120;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_110;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_100;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_e8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_e0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  
  std::
  vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  if ((create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0')
     && (iVar2 = __cxa_guard_acquire(&create_variables(kratos::Var_const*,std::__cxx11::string_const&)
                                      ::empty_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                         empty_abi_cxx11_);
  }
  pvVar5 = Var::size(var);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
  if (sVar6 < 2) {
    pvVar5 = Var::size(var);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar5);
    if (*pvVar7 < 2) {
      uVar3 = (*(var->super_IRNode)._vptr_IRNode[0x17])();
      if ((uVar3 & 1) == 0) {
        VVar4 = Var::type(var);
        if ((VVar4 == Slice) &&
           (uVar3 = (*(var->super_IRNode)._vptr_IRNode[0x2b])(), (uVar3 & 1) != 0)) {
          pvVar5 = Var::size((Var *)var[1].super_IRNode._vptr_IRNode);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar5);
          pVVar11 = VarVarSlice::sliced_var((VarVarSlice *)var);
          (*(pVVar11->super_IRNode)._vptr_IRNode[0x1f])
                    ((undefined1 *)((long)&base_name.field_2 + 8));
          (**(code **)(*var[1].super_IRNode._vptr_IRNode + 0xf8))
                    (&names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ac8,"[].",(allocator<char> *)((long)&new_name_3 + 7));
          string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_aa8,name,&local_ac8);
          std::__cxx11::string::~string((string *)&local_ac8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&new_name_3 + 7));
          format_str = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_aa8,0);
          for (transformed_name.field_2._12_4_ = 0; (uint)transformed_name.field_2._12_4_ < *pvVar10
              ; transformed_name.field_2._12_4_ = transformed_name.field_2._12_4_ + 1) {
            local_250 = (undefined1 *)((long)&new_name_transformed.field_2 + 8);
            local_258 = "{0}[{1}]";
            local_260 = &names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            vargs_6 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)((long)&transformed_name.field_2 + 0xc);
            fmt::v7::make_args_checked<std::__cxx11::string&,unsigned_int&,char[9],char>
                      (&local_298,(v7 *)"{0}[{1}]",(char (*) [9])local_260,
                       (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs_6,
                       (remove_reference_t<unsigned_int_&> *)in_R8.values_);
            local_270 = &local_298;
            bVar13 = fmt::v7::to_string_view<char,_0>(local_258);
            local_68 = &local_2b8;
            local_70 = local_270;
            local_60 = local_270;
            local_50 = local_270;
            local_58 = local_68;
            local_2a8 = bVar13;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args(local_68,0x2d,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_270);
            format_str_06.size_ = local_2b8.desc_;
            format_str_06.data_ = (char *)local_2a8.size_;
            args_05.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_05.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_2b8.field_1.values_;
            aVar12 = local_2b8.field_1;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)((long)&new_name_transformed.field_2 + 8),(detail *)local_2a8.data_
                       ,format_str_06,args_05);
            local_1e0 = (undefined1 *)((long)&cond.field_2 + 8);
            local_1e8 = "{0}.{1}";
            vargs_7 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)((long)&transformed_name.field_2 + 0xc);
            local_1f0 = format_str;
            fmt::v7::make_args_checked<std::__cxx11::string_const&,unsigned_int&,char[8],char>
                      (&local_228,(v7 *)0x431621,(char (*) [8])format_str,
                       (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_7,
                       (remove_reference_t<unsigned_int_&> *)aVar12.values_);
            local_200 = &local_228;
            bVar13 = fmt::v7::to_string_view<char,_0>(local_1e8);
            local_28 = &local_248;
            local_30 = local_200;
            local_20 = local_200;
            local_10 = local_200;
            local_18 = local_28;
            local_238 = bVar13;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args(local_28,0x2d,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_200);
            format_str_07.size_ = local_248.desc_;
            format_str_07.data_ = (char *)local_238.size_;
            args_06.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_06.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_248.field_1.values_;
            aVar12 = local_248.field_1;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)((long)&cond.field_2 + 8),(detail *)local_238.data_,format_str_07,
                       args_06);
            local_178 = &v_3.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._M_engaged;
            local_180 = "{0} == {1}";
            local_188 = (char (*) [11])((long)&base_name.field_2 + 8);
            vargs_8 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)((long)&transformed_name.field_2 + 0xc);
            fmt::v7::make_args_checked<std::__cxx11::string&,unsigned_int&,char[11],char>
                      (&local_1b8,(v7 *)"{0} == {1}",local_188,
                       (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs_8,
                       (remove_reference_t<unsigned_int_&> *)aVar12.values_);
            local_198 = &local_1b8;
            bVar13 = fmt::v7::to_string_view<char,_0>(local_180);
            local_78 = &local_1d8;
            local_80 = local_198;
            local_48 = local_198;
            local_38 = local_198;
            local_40 = local_78;
            local_1c8 = bVar13;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args(local_78,0x2d,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_198);
            format_str_08.size_ = local_1d8.desc_;
            format_str_08.data_ = (char *)local_1c8.size_;
            args_07.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_07.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_1d8.field_1.values_;
            in_R8 = local_1d8.field_1;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)
                       &v_3.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged,
                       (detail *)local_1c8.data_,format_str_08,args_07);
            hgdb::json::Variable::Variable((Variable *)local_b98);
            std::__cxx11::string::operator=
                      ((string *)local_b98,(string *)(cond.field_2._M_local_buf + 8));
            std::__cxx11::string::operator=
                      ((string *)(v_3.name.field_2._M_local_buf + 8),
                       (string *)(new_name_transformed.field_2._M_local_buf + 8));
            v_3.value.field_2._M_local_buf[8] = '\x01';
            std::make_pair<hgdb::json::Variable&,std::__cxx11::string&>
                      ((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&v_4.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._M_engaged,
                       (Variable *)local_b98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &v_3.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged);
            std::
            vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
            ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                      ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                        *)__return_storage_ptr__,
                       (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&v_4.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._M_engaged);
            std::
            pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&v_4.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged);
            hgdb::json::Variable::~Variable((Variable *)local_b98);
            std::__cxx11::string::~string
                      ((string *)
                       &v_3.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged);
            std::__cxx11::string::~string((string *)(cond.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(new_name_transformed.field_2._M_local_buf + 8))
            ;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_aa8);
          std::__cxx11::string::~string
                    ((string *)
                     &names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)(base_name.field_2._M_local_buf + 8));
          return __return_storage_ptr__;
        }
        hgdb::json::Variable::Variable((Variable *)local_c68);
        (*(var->super_IRNode)._vptr_IRNode[0x1f])(local_c88);
        std::__cxx11::string::operator=((string *)(v_4.name.field_2._M_local_buf + 8),local_c88);
        std::__cxx11::string::~string(local_c88);
        std::__cxx11::string::operator=((string *)local_c68,(string *)name);
        v_4.value.field_2._M_local_buf[8] = '\x01';
        std::make_pair<hgdb::json::Variable&,std::__cxx11::string_const&>
                  (&local_d00,(Variable *)local_c68,
                   &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                    empty_abi_cxx11_);
        std::
        vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
        ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                  ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                    *)__return_storage_ptr__,&local_d00);
        std::
        pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_d00);
        hgdb::json::Variable::~Variable((Variable *)local_c68);
        return __return_storage_ptr__;
      }
      VVar4 = Var::type(var);
      if (VVar4 == PortIO) {
        def = (shared_ptr<kratos::PackedStruct> *)var;
        (*(var->super_IRNode)._vptr_IRNode[0x2e])(&__range4);
        local_760 = (__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&__range4;
        peVar8 = std::
                 __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_760);
        __end4 = std::
                 vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                 ::begin(&peVar8->attributes);
        iter = (PackedStructFieldDef *)
               std::
               vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
               end(&peVar8->attributes);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                      *)&iter);
          if (!bVar1) break;
          pPVar9 = __gnu_cxx::
                   __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                   ::operator*(&__end4);
          local_3a0 = &v_1.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_engaged;
          local_3a8 = "{0}.{1}";
          vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)pPVar9;
          local_3b0 = name;
          fmt::v7::
          make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[8],char>
                    (&local_3e8,(v7 *)0x431621,(char (*) [8])name,&pPVar9->name,
                     (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)in_R8.values_);
          local_3c0 = &local_3e8;
          bVar13 = fmt::v7::to_string_view<char,_0>(local_3a8);
          local_c8 = &local_408;
          local_d0 = local_3c0;
          local_98 = local_3c0;
          local_88 = local_3c0;
          local_90 = local_c8;
          local_3f8 = bVar13;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_c8,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_3c0);
          format_str_02.size_ = local_408.desc_;
          format_str_02.data_ = (char *)local_3f8.size_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_408.field_1.values_;
          aVar12 = local_408.field_1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)
                     &v_1.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,
                     (detail *)local_3f8.data_,format_str_02,args_01);
          hgdb::json::Variable::Variable((Variable *)local_810);
          (*(var->super_IRNode)._vptr_IRNode[0x1f])(local_850);
          local_2c0 = &local_830;
          local_2c8 = "{0}.{1}";
          local_2d0 = local_850;
          vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)pPVar9;
          fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[8],char>
                    (&local_308,(v7 *)0x431621,(char (*) [8])local_2d0,&pPVar9->name,
                     (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)aVar12.values_)
          ;
          local_2e0 = &local_308;
          bVar13 = fmt::v7::to_string_view<char,_0>(local_2c8);
          local_168 = &local_328;
          local_170 = local_2e0;
          local_140 = local_2e0;
          local_130 = local_2e0;
          local_138 = local_168;
          local_318 = bVar13;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_168,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_2e0);
          format_str_03.size_ = local_328.desc_;
          format_str_03.data_ = (char *)local_318.size_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_328.field_1.values_;
          in_R8 = local_328.field_1;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_830,(detail *)local_318.data_,format_str_03,args_02);
          std::__cxx11::string::operator=
                    ((string *)(v_1.name.field_2._M_local_buf + 8),(string *)&local_830);
          std::__cxx11::string::~string((string *)&local_830);
          std::__cxx11::string::~string(local_850);
          std::__cxx11::string::operator=
                    ((string *)local_810,
                     (string *)
                     &v_1.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
          v_1.value.field_2._M_local_buf[8] = '\x01';
          std::make_pair<hgdb::json::Variable&,std::__cxx11::string_const&>
                    ((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&p_1,(Variable *)local_810,
                     &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                      empty_abi_cxx11_);
          std::
          vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
          ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                    ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                      *)__return_storage_ptr__,
                     (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&p_1);
          std::
          pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&p_1);
          hgdb::json::Variable::~Variable((Variable *)local_810);
          std::__cxx11::string::~string
                    ((string *)
                     &v_1.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
          __gnu_cxx::
          __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
          ::operator++(&__end4);
        }
        std::shared_ptr<kratos::PackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::PackedStruct> *)&__range4);
        return __return_storage_ptr__;
      }
      VVar4 = Var::type(var);
      if (VVar4 != Base) {
        return __return_storage_ptr__;
      }
      def_1 = (shared_ptr<kratos::PackedStruct> *)var;
      (*(var->super_IRNode)._vptr_IRNode[0x2d])(&__range5);
      local_8d8 = (__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)&__range5;
      peVar8 = std::
               __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_8d8);
      __end5 = std::
               vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
               begin(&peVar8->attributes);
      iter_1 = (PackedStructFieldDef *)
               std::
               vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
               end(&peVar8->attributes);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end5,(__normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                    *)&iter_1);
        if (!bVar1) break;
        pPVar9 = __gnu_cxx::
                 __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                 ::operator*(&__end5);
        local_410 = &v_2.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_engaged;
        local_418 = "{0}.{1}";
        vargs_4 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pPVar9;
        local_420 = name;
        fmt::v7::
        make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[8],char>
                  (&local_458,(v7 *)0x431621,(char (*) [8])name,&pPVar9->name,
                   (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)in_R8.values_);
        local_430 = &local_458;
        bVar13 = fmt::v7::to_string_view<char,_0>(local_418);
        local_b8 = &local_478;
        local_c0 = local_430;
        local_b0 = local_430;
        local_a0 = local_430;
        local_a8 = local_b8;
        local_468 = bVar13;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_b8,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_430);
        format_str_04.size_ = local_478.desc_;
        format_str_04.data_ = (char *)local_468.size_;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_478.field_1.values_;
        aVar12 = local_478.field_1;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &v_2.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged,(detail *)local_468.data_
                   ,format_str_04,args_03);
        hgdb::json::Variable::Variable((Variable *)local_988);
        (*(var->super_IRNode)._vptr_IRNode[0x1f])(local_9c8);
        local_330 = &local_9a8;
        local_338 = "{0}.{1}";
        local_340 = local_9c8;
        vargs_5 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pPVar9;
        fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[8],char>
                  (&local_378,(v7 *)0x431621,(char (*) [8])local_340,&pPVar9->name,
                   (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)aVar12.values_);
        local_350 = &local_378;
        bVar13 = fmt::v7::to_string_view<char,_0>(local_338);
        local_158 = &local_398;
        local_160 = local_350;
        local_150 = local_350;
        local_128 = local_350;
        local_148 = local_158;
        local_388 = bVar13;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_158,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_350);
        format_str_05.size_ = local_398.desc_;
        format_str_05.data_ = (char *)local_388.size_;
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_398.field_1.values_;
        in_R8 = local_398.field_1;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_9a8,(detail *)local_388.data_,format_str_05,args_04);
        std::__cxx11::string::operator=
                  ((string *)(v_2.name.field_2._M_local_buf + 8),(string *)&local_9a8);
        std::__cxx11::string::~string((string *)&local_9a8);
        std::__cxx11::string::~string(local_9c8);
        std::__cxx11::string::operator=
                  ((string *)local_988,
                   (string *)
                   &v_2.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged);
        v_2.value.field_2._M_local_buf[8] = '\x01';
        std::make_pair<hgdb::json::Variable&,std::__cxx11::string_const&>
                  ((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&var_var_slice,(Variable *)local_988,
                   &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                    empty_abi_cxx11_);
        std::
        vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
        ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                  ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                    *)__return_storage_ptr__,
                   (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&var_var_slice);
        std::
        pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&var_var_slice);
        hgdb::json::Variable::~Variable((Variable *)local_988);
        std::__cxx11::string::~string
                  ((string *)
                   &v_2.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged);
        __gnu_cxx::
        __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
        ::operator++(&__end5);
      }
      std::shared_ptr<kratos::PackedStruct>::~shared_ptr
                ((shared_ptr<kratos::PackedStruct> *)&__range5);
      return __return_storage_ptr__;
    }
  }
  get_flatten_slices((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)&__range2,var);
  __end2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&__range2);
  slice = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&slice);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator*(&__end2);
    std::__cxx11::string::string
              ((string *)
               &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged,(string *)name);
    hgdb::json::Variable::Variable((Variable *)&__range3);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
    s = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&s);
      if (!bVar1) break;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
               *)__gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3);
      local_4f0 = (undefined1 *)((long)&value.field_2 + 8);
      local_4f8 = "{0}.{1}";
      local_500 = &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_engaged;
      fmt::v7::make_args_checked<std::__cxx11::string&,unsigned_int_const&,char[8],char>
                (&local_538,(v7 *)0x431621,(char (*) [8])local_500,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,
                 (remove_reference_t<const_unsigned_int_&> *)in_R8.values_);
      local_510 = &local_538;
      bVar13 = fmt::v7::to_string_view<char,_0>(local_4f8);
      local_108 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)&result;
      local_110 = local_510;
      local_100 = local_510;
      local_f0 = local_510;
      local_f8 = local_108;
      local_548 = bVar13;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_108,0x2d,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_510);
      format_str_00.size_ = (size_t)result;
      format_str_00.data_ = (char *)local_548.size_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_550.values_;
      in_R8 = local_550;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)((long)&value.field_2 + 8),(detail *)local_548.data_,format_str_00,args);
      std::__cxx11::string::operator=
                ((string *)
                 &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged,
                 (string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
    (*(var->super_IRNode)._vptr_IRNode[0x1f])(&__range3_1);
    __end3_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
    s_1 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&s_1);
      if (!bVar1) break;
      local_6b8 = (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end3_1);
      local_480 = &local_6d8;
      local_488 = "{0}[{1}]";
      local_490 = (char (*) [9])&__range3_1;
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
                 *)local_6b8;
      fmt::v7::make_args_checked<std::__cxx11::string&,unsigned_int_const&,char[9],char>
                (&local_4c8,(v7 *)"{0}[{1}]",local_490,local_6b8,
                 (remove_reference_t<const_unsigned_int_&> *)in_R8.values_);
      local_4a0 = &local_4c8;
      bVar13 = fmt::v7::to_string_view<char,_0>(local_488);
      local_118 = &local_4e8;
      local_120 = local_4a0;
      local_e8 = local_4a0;
      local_d8 = local_4a0;
      local_e0 = local_118;
      local_4d8 = bVar13;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_118,0x2d,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_4a0);
      format_str_01.size_ = local_4e8.desc_;
      format_str_01.data_ = (char *)local_4d8.size_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_4e8.field_1.values_;
      in_R8 = local_4e8.field_1;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_6d8,(detail *)local_4d8.data_,format_str_01,args_00);
      std::__cxx11::string::operator=((string *)&__range3_1,(string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3_1);
    }
    std::__cxx11::string::operator=
              ((string *)(v.name.field_2._M_local_buf + 8),(string *)&__range3_1);
    std::__cxx11::string::operator=
              ((string *)&__range3,
               (string *)
               &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged);
    v.value.field_2._M_local_buf[8] = '\x01';
    std::make_pair<hgdb::json::Variable&,std::__cxx11::string_const&>
              ((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&p,(Variable *)&__range3,
               &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_);
    std::
    vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
    ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
              ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                *)__return_storage_ptr__,
               (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&p);
    std::
    pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&p);
    std::__cxx11::string::~string((string *)&__range3_1);
    hgdb::json::Variable::~Variable((Variable *)&__range3);
    std::__cxx11::string::~string
              ((string *)
               &v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<VarCondition> create_variables(const Var *var, const std::string &name) {
    std::vector<VarCondition> result;
    const static std::string empty;
    if (var->size().size() > 1 || var->size().front() > 1) {
        // it's an array. need to flatten it
        auto slices = get_flatten_slices(var);
        for (auto const &slice : slices) {
            std::string new_name = name;
            hgdb::json::Variable v;
            for (auto const &s : slice) new_name = ::format("{0}.{1}", new_name, s);
            std::string value = var->to_string();
            for (auto const &s : slice) value = ::format("{0}[{1}]", value, s);
            v.value = value;
            v.name = new_name;
            v.rtl = true;
            result.emplace_back(std::make_pair(v, empty));
        }
    } else if (var->is_struct()) {
        // it's a packed array
        if (var->type() == VarType::PortIO) {
            auto const *p = reinterpret_cast<const PortPackedStruct *>(var);
            auto const &def = p->packed_struct();
            for (auto const &iter : def->attributes) {
                auto const &attr_name = iter.name;
                // we need to store lots of them
                std::string new_name = ::format("{0}.{1}", name, attr_name);
                hgdb::json::Variable v;
                v.value = ::format("{0}.{1}", var->to_string(), attr_name);
                v.name = new_name;
                v.rtl = true;
                result.emplace_back(std::make_pair(v, empty));
            }
        } else if (var->type() == VarType::Base) {
            auto const *p = reinterpret_cast<const VarPackedStruct *>(var);
            auto const &def = p->packed_struct();
            for (auto const &iter : def->attributes) {
                auto const &attr_name = iter.name;
                // we need to store lots of them
                std::string new_name = ::format("{0}.{1}", name, attr_name);
                hgdb::json::Variable v;
                v.value = ::format("{0}.{1}", var->to_string(), attr_name);
                v.name = new_name;
                v.rtl = true;
                result.emplace_back(std::make_pair(v, empty));
            }
        }
    } else if (var->type() == VarType::Slice &&
               reinterpret_cast<const VarSlice *>(var)->sliced_by_var()) {
        auto const *var_var_slice = reinterpret_cast<const VarVarSlice *>(var);
        // for now, we flatten out the access and only one-level of slicing
        auto const &size = var_var_slice->parent_var->size().front();
        auto select_name = var_var_slice->sliced_var()->to_string();
        auto base_name = var_var_slice->parent_var->to_string();
        // need to get the actual name. notice that we might get to_string() name,
        // in this case it might be wrong
        auto names = string::get_tokens(name, "[].");
        auto const &new_name = names[0];
        for (auto i = 0u; i < size; i++) {
            auto transformed_name = fmt::format("{0}[{1}]", base_name, i);
            auto new_name_transformed = fmt::format("{0}.{1}", new_name, i);
            auto cond = fmt::format("{0} == {1}", select_name, i);
            // the usage is setting var[10] as a watch point
            hgdb::json::Variable v;
            v.name = new_name_transformed;
            v.value = transformed_name;
            v.rtl = true;
            result.emplace_back(std::make_pair(v, cond));
        }
    } else {
        // the normal one
        hgdb::json::Variable v;
        v.value = var->to_string();
        v.name = name;
        v.rtl = true;
        result.emplace_back(std::make_pair(v, empty));
    }
    return result;
}